

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O2

int Mvc_CoverIsTautology(Mvc_Cover_t *pCover)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((pCover->lCubes).nItems == 1) {
    uVar4 = 0;
    uVar2 = pCover->nBits;
    if (pCover->nBits < 1) {
      uVar2 = 0;
    }
    do {
      uVar3 = (uint)uVar4;
      if (uVar2 == uVar3) {
        return 1;
      }
      uVar1 = uVar4 >> 5;
      uVar4 = (ulong)(uVar3 + 1);
    } while ((((pCover->lCubes).pHead)->pData[uVar1] >> (uVar3 & 0x1f) & 1) != 0);
  }
  return 0;
}

Assistant:

int Mvc_CoverIsTautology( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int iBit, Value;

    if ( Mvc_CoverReadCubeNum(pCover) != 1 )
        return 0;

    pCube = Mvc_CoverReadCubeHead( pCover );
    Mvc_CubeForEachBit( pCover, pCube, iBit, Value )
        if ( Value == 0 )
            return 0;
    return 1;
}